

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distribution.cpp
# Opt level: O2

void test_distribute<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>,MxxDistribution_DistributePairVector_Test::TestBody()::__0>
               (size_t size,comm *param_2)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  size_t i;
  size_t sVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  AssertHelper AStack_98;
  T expected;
  AssertionResult gtest_ar;
  AssertHelper local_78;
  size_t eq_size;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> vec;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> eq_distr;
  size_t size_local;
  
  size_local = size;
  uVar1 = mxx::exscan<unsigned_long>(&size_local,param_2);
  uVar2 = mxx::allreduce<unsigned_long,std::plus<unsigned_long>>(&size_local,param_2);
  vec.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vec.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vec.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize(&vec,size_local);
  srand(param_2->m_rank * 0xd);
  for (sVar3 = 0; size_local != sVar3; sVar3 = sVar3 + 1) {
    iVar4 = (int)uVar1 + (int)sVar3;
    vec.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_start[sVar3].first = iVar4;
    vec.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_start[sVar3].second = iVar4;
  }
  mxx::impl::
  distribute_container<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::
  distribute(&eq_distr,&vec,param_2);
  mxx::impl::
  distribute_container<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::
  distribute_inplace(&vec,param_2);
  eq_size = uVar2 / (ulong)(long)param_2->m_size;
  if ((ulong)(long)param_2->m_rank < uVar2 % (ulong)(long)param_2->m_size) {
    eq_size = eq_size + 1;
  }
  uVar1 = mxx::exscan<unsigned_long>(&eq_size,param_2);
  expected = (T)((long)eq_distr.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)eq_distr.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"eq_size","eq_distr.size()",&eq_size,(unsigned_long *)&expected);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&expected);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_98,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_distribution.cpp"
               ,0x36,pcVar5);
    testing::internal::AssertHelper::operator=(&AStack_98,(Message *)&expected);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    expected = (T)((long)vec.
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)vec.
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar,"eq_size","vec.size()",&eq_size,(unsigned_long *)&expected);
    if (gtest_ar.success_ != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      mxx::impl::
      samplesort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>,false>
                (vec.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 vec.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish,param_2);
      mxx::impl::
      samplesort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>,false>
                (eq_distr.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 eq_distr.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish,param_2);
      lVar6 = 0;
      for (uVar7 = 0;
          uVar7 < (ulong)((long)eq_distr.
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)eq_distr.
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1)
      {
        expected = (T)((ulong)(uint)((int)uVar1 + (int)uVar7) * 0x100000001);
        testing::internal::CmpHelperEQ<std::pair<int,int>,std::pair<int,int>>
                  ((internal *)&gtest_ar,"expected","eq_distr[i]",&expected,
                   (pair<int,_int> *)
                   ((long)&(eq_distr.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->first + lVar6));
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&AStack_98);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar5 = "";
          }
          else {
            pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_78,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_distribution.cpp"
                     ,0x3e,pcVar5);
          testing::internal::AssertHelper::operator=(&local_78,(Message *)&AStack_98);
LAB_001096c3:
          testing::internal::AssertHelper::~AssertHelper(&local_78);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&AStack_98);
          goto LAB_00109615;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        testing::internal::CmpHelperEQ<std::pair<int,int>,std::pair<int,int>>
                  ((internal *)&gtest_ar,"expected","vec[i]",&expected,
                   (pair<int,_int> *)
                   ((long)&(vec.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->first + lVar6));
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&AStack_98);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar5 = "";
          }
          else {
            pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_78,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_distribution.cpp"
                     ,0x3f,pcVar5);
          testing::internal::AssertHelper::operator=(&local_78,(Message *)&AStack_98);
          goto LAB_001096c3;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        lVar6 = lVar6 + 8;
      }
      goto LAB_0010961a;
    }
    testing::Message::Message((Message *)&expected);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_98,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_distribution.cpp"
               ,0x37,pcVar5);
    testing::internal::AssertHelper::operator=(&AStack_98,(Message *)&expected);
  }
  testing::internal::AssertHelper::~AssertHelper(&AStack_98);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&expected);
LAB_00109615:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
LAB_0010961a:
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            (&eq_distr.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            (&vec.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
  return;
}

Assistant:

void test_distribute(size_t size, Func gen, const mxx::comm& c) {
    size_t prefix = mxx::exscan(size, c);
    size_t total_size = mxx::allreduce(size, c);

    typedef typename Container::value_type T;
    Container vec;
    vec.resize(size);
    std::srand(13*c.rank());
    for (size_t i = 0; i < size; ++i) {
        vec[i] = gen(prefix+i);
    }

    // stable distribute
    Container eq_distr = mxx::distribute(vec, c);
    mxx::distribute_inplace(vec, c);

    // get expected size
    size_t eq_size = total_size / c.size();
    if ((size_t)c.rank() < total_size % c.size())
        eq_size+=1;
    size_t eq_prefix = mxx::exscan(eq_size, c);

    ASSERT_EQ(eq_size, eq_distr.size());
    ASSERT_EQ(eq_size, vec.size());

    mxx::sort(vec.begin(), vec.end(), c);
    mxx::sort(eq_distr.begin(), eq_distr.end(), c);

    for (size_t i = 0; i < eq_distr.size(); ++i) {
        T expected = gen(eq_prefix+i);
        ASSERT_EQ(expected, eq_distr[i]);
        ASSERT_EQ(expected, vec[i]);
    }
}